

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::StructuredAssignmentPatternExpression::forStruct
          (Compilation *comp,StructuredAssignmentPatternSyntax *syntax,ASTContext *context,
          Type *type,Scope *structScope,SourceRange sourceRange)

{
  char *pcVar1;
  undefined4 uVar2;
  SyntaxKind kind;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  SyntaxNode *this;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  span<const_slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
  typeSetters_00;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  Type *pTVar10;
  uint32_t extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  StructuredAssignmentPatternExpression *expr;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar11;
  Type *this_00;
  Expression *pEVar12;
  Symbol *this_01;
  Diagnostic *pDVar13;
  size_type sVar14;
  ulong uVar16;
  Symbol *extraout_RDX;
  Symbol *extraout_RDX_00;
  Symbol *extraout_RDX_01;
  Symbol *extraout_RDX_02;
  Symbol *extraout_RDX_03;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar17;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  FieldSymbol *field;
  uint uVar18;
  long lVar19;
  Symbol *pSVar20;
  ulong uVar21;
  Scope *hash;
  byte bVar22;
  byte bVar23;
  size_type sVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  string_view name;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  sVar31;
  SourceRange SVar32;
  string_view name_00;
  SourceRange assignmentRange;
  SourceRange assignmentRange_00;
  bitmask<slang::ast::ASTFlags> extraFlags;
  Expression *defaultSetter;
  Token nameToken;
  Symbol *member;
  Type *local_260;
  Symbol *local_258;
  Symbol *local_250;
  SmallVector<const_slang::ast::Expression_*,_5UL> elements;
  span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
  local_208 [3];
  ulong local_1d8;
  StructuredAssignmentPatternSyntax *local_1d0;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_1c8;
  pointer local_1b8;
  size_type sStack_1b0;
  SmallMap<const_slang::ast::Symbol_*,_const_slang::ast::Expression_*,_8UL,_std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
  memberMap;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_4UL> typeSetters;
  SmallVector<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_4UL> memberSetters;
  specific_symbol_iterator<slang::ast::FieldSymbol> targetField;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar15;
  
  bVar23 = 0;
  memberMap.super_Storage.ptr = (char *)&memberMap;
  memberMap._144_8_ = 0x3f;
  memberMap._152_8_ = 1;
  memberMap._160_8_ =
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  memberMap._168_8_ = 0;
  memberMap._176_8_ = 0;
  defaultSetter = (Expression *)0x0;
  memberMap._184_8_ = 0;
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.data_ =
       (pointer)memberSetters.
                super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                .firstElement;
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.len = 0;
  memberSetters.
  super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.cap = 4;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  data_ = (pointer)typeSetters.
                   super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                   .firstElement;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  len = 0;
  typeSetters.super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
  cap = 4;
  local_250 = (Symbol *)((syntax->items).elements._M_extent._M_extent_value + 1);
  extraFlags.m_bits = (underlying_type)context;
  local_260 = type;
  local_258 = (Symbol *)structScope;
  local_1d0 = syntax;
  memberMap.super_Storage._136_8_ = memberMap.super_Storage.ptr;
  if ((Symbol *)0x1 < local_250) {
    local_250 = (Symbol *)((ulong)local_250 >> 1);
    bVar23 = 0;
    pSVar20 = (Symbol *)0x0;
    do {
      ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((local_1d0->items).elements._M_ptr + (long)pSVar20 * 2));
      pSVar3 = *ppSVar11;
      this = *(SyntaxNode **)(pSVar3 + 1);
      kind = this->kind;
      if (kind == IdentifierName) {
        nameToken._0_8_ = *(undefined8 *)(this + 1);
        nameToken.info = (Info *)this[1].parent;
        name_00 = parsing::Token::valueText(&nameToken);
        name._M_len = name_00._M_str;
        if ((Scope *)name_00._M_len == (Scope *)0x0) {
          bVar23 = 1;
        }
        else {
          member = Scope::find((Scope *)local_258,name_00);
          if (member == (Symbol *)0x0) {
            name._M_str = (char *)0x1;
            this_01 = Lookup::unqualified((Lookup *)((Scope *)context)->compilation,
                                          (Scope *)name_00._M_len,name,
                                          (bitmask<slang::ast::LookupFlags>)
                                          (underlying_type)structScope);
            context = (ASTContext *)extraFlags.m_bits;
            if ((this_01 == (Symbol *)0x0) ||
               (bVar7 = Symbol::isType(this_01), context = (ASTContext *)extraFlags.m_bits, !bVar7))
            {
              SVar32 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
              pDVar13 = ASTContext::addDiag(context,(DiagCode)0x3a000a,SVar32);
              Diagnostic::operator<<(pDVar13,name_00);
              bVar23 = 1;
              ast::operator<<(pDVar13,local_260);
              extraFlags.m_bits = (underlying_type)context;
            }
            else {
              pTVar10 = *(Type **)(pSVar3 + 2);
              structScope = (Scope *)extraFlags.m_bits;
              SVar32 = parsing::Token::range(&nameToken);
              assignmentRange_00.endLoc = (SourceLocation)structScope;
              assignmentRange_00.startLoc = SVar32.endLoc;
              context = (ASTContext *)structScope;
              pEVar12 = Expression::bindRValue
                                  ((Expression *)this_01,pTVar10,(ExpressionSyntax *)SVar32.startLoc
                                   ,assignmentRange_00,(ASTContext *)0x0,
                                   (bitmask<slang::ast::ASTFlags>)structScope);
              bVar7 = Expression::bad(pEVar12);
              elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
                   (pointer)this_01;
              elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
                   (size_type)pEVar12;
              SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
              emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                        (&typeSetters.
                          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                         ,(TypeSetter *)&elements);
              bVar23 = bVar23 | bVar7;
              extraFlags.m_bits = (underlying_type)context;
            }
          }
          else {
            this_00 = DeclaredType::getType((DeclaredType *)(member + 1));
            pTVar10 = *(Type **)(pSVar3 + 2);
            SVar32 = parsing::Token::range(&nameToken);
            assignmentRange.endLoc = (SourceLocation)extraFlags.m_bits;
            assignmentRange.startLoc = SVar32.endLoc;
            pEVar12 = Expression::bindRValue
                                ((Expression *)this_00,pTVar10,(ExpressionSyntax *)SVar32.startLoc,
                                 assignmentRange,(ASTContext *)0x0,extraFlags);
            bVar7 = Expression::bad(pEVar12);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = member;
            hash = (Scope *)(SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                            SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0));
            uVar21 = (ulong)hash >> (memberMap._144_1_ & 0x3f);
            bVar23 = bVar23 | bVar7;
            local_208[0]._M_ptr = (pointer)pEVar12;
            uVar2 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      match_word(unsigned_long)::word)[(ulong)hash & 0xff];
            local_208[1]._M_extent._M_extent_value = memberMap._152_8_;
            local_208[2]._M_extent._M_extent_value = memberMap._160_8_;
            local_208[2]._M_ptr = (pointer)memberMap._168_8_;
            uVar9 = uVar21;
            uVar16 = 0;
            do {
              local_1d8 = uVar16;
              pcVar1 = (char *)(memberMap._160_8_ + uVar9 * 0x10);
              cVar25 = (char)uVar2;
              auVar30[0] = -(*pcVar1 == cVar25);
              cVar26 = (char)((uint)uVar2 >> 8);
              auVar30[1] = -(pcVar1[1] == cVar26);
              cVar27 = (char)((uint)uVar2 >> 0x10);
              auVar30[2] = -(pcVar1[2] == cVar27);
              cVar28 = (char)((uint)uVar2 >> 0x18);
              auVar30[3] = -(pcVar1[3] == cVar28);
              auVar30[4] = -(pcVar1[4] == cVar25);
              auVar30[5] = -(pcVar1[5] == cVar26);
              auVar30[6] = -(pcVar1[6] == cVar27);
              auVar30[7] = -(pcVar1[7] == cVar28);
              auVar30[8] = -(pcVar1[8] == cVar25);
              auVar30[9] = -(pcVar1[9] == cVar26);
              auVar30[10] = -(pcVar1[10] == cVar27);
              auVar30[0xb] = -(pcVar1[0xb] == cVar28);
              auVar30[0xc] = -(pcVar1[0xc] == cVar25);
              auVar30[0xd] = -(pcVar1[0xd] == cVar26);
              auVar30[0xe] = -(pcVar1[0xe] == cVar27);
              auVar30[0xf] = -(pcVar1[0xf] == cVar28);
              uVar18 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
              if (uVar18 != 0) {
                lVar19 = memberMap._168_8_ + uVar9 * 0xf0;
                do {
                  iVar8 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
                    }
                  }
                  if (member == *(Symbol **)(lVar19 + (ulong)(uint)(iVar8 << 4))) {
                    sVar14 = (ulong)(uint)(iVar8 << 4) + lVar19;
                    goto LAB_00374910;
                  }
                  uVar18 = uVar18 - 1 & uVar18;
                } while (uVar18 != 0);
              }
              if ((*(byte *)(uVar9 * 0x10 + memberMap._160_8_ + 0xf) &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
              uVar9 = uVar9 + local_1d8 + 1 & memberMap._152_8_;
              uVar16 = local_1d8 + 1;
            } while (local_1d8 + 1 <= (ulong)memberMap._152_8_);
            sVar14 = 0;
LAB_00374910:
            structScope = hash;
            sVar24 = sVar14;
            context = (ASTContext *)extraFlags.m_bits;
            if (sVar14 == 0) {
              if ((ulong)memberMap._184_8_ < (ulong)memberMap._176_8_) {
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Expression_const*>
                          ((locator *)&elements,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                            *)&memberMap.super_Storage.field_0x88,
                           (arrays_type *)&memberMap.field_0x90,uVar21,(size_t)hash,
                           (try_emplace_args_t *)&local_1c8,&member,(Expression **)local_208);
                memberMap._184_8_ = memberMap._184_8_ + 1;
                structScope = hash;
                sVar24 = elements.super_SmallVectorBase<const_slang::ast::Expression_*>.cap;
                context = (ASTContext *)extraFlags.m_bits;
              }
              else {
                structScope = (Scope *)&member;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*&,slang::ast::Expression_const*>
                          ((locator *)&elements,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::ast::Expression_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::Symbol_const*const,slang::ast::Expression_const*>,128ul,16ul>>
                            *)&memberMap.super_Storage.field_0x88,(size_t)hash,
                           (try_emplace_args_t *)&local_1c8,(Symbol **)structScope,
                           (Expression **)local_208);
                sVar24 = elements.super_SmallVectorBase<const_slang::ast::Expression_*>.cap;
                context = (ASTContext *)extraFlags.m_bits;
              }
            }
            if (sVar14 == 0) {
              elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)member
              ;
              elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
                   (size_type)pEVar12;
              SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::
              emplace_back<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                        (&memberSetters.
                          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                         ,(MemberSetter *)&elements);
              extraFlags.m_bits = (underlying_type)context;
            }
            else {
              SVar32 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
              pDVar13 = ASTContext::addDiag(context,(DiagCode)0x100007,SVar32);
              Diagnostic::operator<<(pDVar13,name_00);
              bVar23 = 1;
              Diagnostic::addNote(pDVar13,(DiagCode)0xa0001,
                                  *(SourceRange *)(*(long *)(sVar24 + 8) + 0x20));
              extraFlags.m_bits = (underlying_type)context;
            }
          }
        }
      }
      else if (kind == DefaultPatternKeyExpression) {
        if (defaultSetter != (Expression *)0x0) {
          SVar32 = slang::syntax::SyntaxNode::sourceRange(this);
          bVar23 = 1;
          ASTContext::addDiag(context,(DiagCode)0xf0007,SVar32);
        }
        defaultSetter =
             Expression::selfDetermined
                       (comp,*(ExpressionSyntax **)(pSVar3 + 2),context,
                        (bitmask<slang::ast::ASTFlags>)0x0);
        bVar7 = Expression::bad(defaultSetter);
LAB_003745b8:
        bVar23 = bVar23 | bVar7;
      }
      else {
        bVar7 = slang::syntax::DataTypeSyntax::isKind(kind);
        if (bVar7) {
          pTVar10 = Compilation::getType
                              (comp,(DataTypeSyntax *)*(SyntaxNode **)(pSVar3 + 1),context,
                               (Type *)0x0);
          bVar7 = Type::isSimpleType(pTVar10);
          if (bVar7) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = context;
            structScope = (Scope *)context;
            pEVar12 = Expression::bindRValue
                                ((Expression *)pTVar10,*(Type **)(pSVar3 + 2),
                                 (ExpressionSyntax *)0x0,(SourceRange)(auVar6 << 0x40),
                                 (ASTContext *)0x0,extraFlags);
            elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ = (pointer)pTVar10;
            elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = (size_type)pEVar12;
            SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
            emplace_back<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                      (&typeSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                       ,(TypeSetter *)&elements);
            bVar7 = Expression::bad(pEVar12);
            goto LAB_003745b8;
          }
          SVar32 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
          bVar23 = 1;
          ASTContext::addDiag(context,(DiagCode)0x120007,SVar32);
        }
        else {
          SVar32 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(pSVar3 + 1));
          bVar23 = 1;
          ASTContext::addDiag(context,(DiagCode)0x120007,SVar32);
        }
      }
      pSVar20 = (Symbol *)((long)&pSVar20->kind + 1);
    } while (pSVar20 != local_250);
  }
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
       (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
  elements.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
  sVar31 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)local_258);
  sVar15 = sVar31._M_end.current;
  targetField = sVar31._M_begin.current;
  do {
    bVar7 = targetField.current == sVar15.current;
    targetField = sVar31._M_begin.current;
    if (bVar7) {
      nameToken._0_4_ =
           SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>::copy
                     (&memberSetters.
                       super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                      ,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)sVar31._M_end.current.current);
      nameToken.rawLen = extraout_var;
      iVar8 = SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::copy
                        (&typeSetters.
                          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                         ,(EVP_PKEY_CTX *)comp,src);
      member = (Symbol *)CONCAT44(extraout_var_00,iVar8);
      local_208[0]._M_ptr = (pointer)0x0;
      local_208[0]._M_extent._M_extent_value = 0;
      iVar8 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (&elements.super_SmallVectorBase<const_slang::ast::Expression_*>,
                         (EVP_PKEY_CTX *)comp,src_00);
      local_1c8._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar8);
      expr = BumpAllocator::
             emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,std::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,std::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter_const,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                       (&comp->super_BumpAllocator,local_260,
                        (span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
                         *)&nameToken,
                        (span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                         *)&member,local_208,&defaultSetter,&local_1c8,&sourceRange);
      if (bVar23 != 0) {
        expr = (StructuredAssignmentPatternExpression *)Expression::badExpr(comp,(Expression *)expr)
        ;
      }
      if (elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ !=
          (pointer)elements.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement) {
        operator_delete(elements.super_SmallVectorBase<const_slang::ast::Expression_*>.data_);
      }
      if (typeSetters.
          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.data_
          != (pointer)typeSetters.
                      super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                      .firstElement) {
        operator_delete(typeSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                        .data_);
      }
      if (memberSetters.
          super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>.
          data_ != (pointer)memberSetters.
                            super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                            .firstElement) {
        operator_delete(memberSetters.
                        super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::MemberSetter>
                        .data_);
      }
      boost::unordered::detail::foa::
      table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
      ::delete_((allocator_type)memberMap.super_Storage._136_8_,
                (table_arrays<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::Symbol_*const,_const_slang::ast::Expression_*>,_128UL,_16UL>_>
                 *)&memberMap.field_0x90);
      return (Expression *)expr;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = targetField.current;
    uVar16 = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar9 = uVar16 >> (memberMap._144_1_ & 0x3f);
    uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar16 & 0xff];
    uVar21 = 0;
    do {
      pcVar1 = (char *)(memberMap._160_8_ + uVar9 * 0x10);
      cVar25 = (char)uVar2;
      auVar29[0] = -(*pcVar1 == cVar25);
      cVar26 = (char)((uint)uVar2 >> 8);
      auVar29[1] = -(pcVar1[1] == cVar26);
      cVar27 = (char)((uint)uVar2 >> 0x10);
      auVar29[2] = -(pcVar1[2] == cVar27);
      cVar28 = (char)((uint)uVar2 >> 0x18);
      auVar29[3] = -(pcVar1[3] == cVar28);
      auVar29[4] = -(pcVar1[4] == cVar25);
      auVar29[5] = -(pcVar1[5] == cVar26);
      auVar29[6] = -(pcVar1[6] == cVar27);
      auVar29[7] = -(pcVar1[7] == cVar28);
      auVar29[8] = -(pcVar1[8] == cVar25);
      auVar29[9] = -(pcVar1[9] == cVar26);
      auVar29[10] = -(pcVar1[10] == cVar27);
      auVar29[0xb] = -(pcVar1[0xb] == cVar28);
      auVar29[0xc] = -(pcVar1[0xc] == cVar25);
      auVar29[0xd] = -(pcVar1[0xd] == cVar26);
      auVar29[0xe] = -(pcVar1[0xe] == cVar27);
      auVar29[0xf] = -(pcVar1[0xf] == cVar28);
      uVar18 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
      if (uVar18 != 0) {
        lVar19 = memberMap._168_8_ + uVar9 * 0xf0;
        do {
          iVar8 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> iVar8 & 1) == 0; iVar8 = iVar8 + 1) {
            }
          }
          if ((FieldSymbol *)targetField.current ==
              *(FieldSymbol **)(lVar19 + (ulong)(uint)(iVar8 << 4))) {
            lVar19 = (ulong)(uint)(iVar8 << 4) + lVar19;
            goto LAB_00374347;
          }
          uVar18 = uVar18 - 1 & uVar18;
        } while (uVar18 != 0);
      }
      if ((*(byte *)(uVar9 * 0x10 + memberMap._160_8_ + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7]) == 0) break;
      lVar19 = uVar9 + uVar21;
      uVar21 = uVar21 + 1;
      uVar9 = lVar19 + 1U & memberMap._152_8_;
    } while (uVar21 <= (ulong)memberMap._152_8_);
    lVar19 = 0;
LAB_00374347:
    if (lVar19 == 0) {
      pTVar10 = DeclaredType::getType((DeclaredType *)(targetField.current + 1));
      sVar17.current = extraout_RDX_00;
      if (pTVar10->canonical == (Type *)0x0) {
        Type::resolveCanonical(pTVar10);
        sVar17.current = extraout_RDX_01;
      }
      bVar22 = 1;
      if (((pTVar10->canonical->super_Symbol).kind != ErrorType) &&
         (((targetField.current)->name)._M_len != 0)) {
        SVar32.endLoc = sourceRange.endLoc;
        SVar32.startLoc = sourceRange.startLoc;
        local_1b8 = typeSetters.
                    super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                    .data_;
        sStack_1b0 = typeSetters.
                     super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
                     .len;
        typeSetters_00._M_extent._M_extent_value =
             typeSetters.
             super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
             len;
        typeSetters_00._M_ptr =
             typeSetters.
             super_SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>.
             data_;
        nameToken._0_8_ =
             matchElementValue((ASTContext *)extraFlags.m_bits,pTVar10,
                               (FieldSymbol *)targetField.current,SVar32,typeSetters_00,
                               defaultSetter);
        if ((Expression *)nameToken._0_8_ == (Expression *)0x0) {
          bVar22 = 1;
          sVar17.current = extraout_RDX_02;
        }
        else {
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*const&>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,
                     (Expression **)&nameToken);
          sVar17.current = extraout_RDX_03;
          bVar22 = bVar23;
        }
      }
    }
    else {
      SmallVectorBase<slang::ast::Expression_const*>::
      emplace_back<slang::ast::Expression_const*const&>
                ((SmallVectorBase<slang::ast::Expression_const*> *)&elements,
                 (Expression **)(lVar19 + 8));
      sVar17.current = extraout_RDX;
      bVar22 = bVar23;
    }
    do {
      targetField.current =
           (((FieldSymbol *)targetField.current)->super_VariableSymbol).super_ValueSymbol.
           super_Symbol.nextInScope;
      sVar31._M_end.current = sVar17.current;
      sVar31._M_begin.current = targetField.current;
      bVar23 = bVar22;
      if ((FieldSymbol *)targetField.current == (FieldSymbol *)0x0) break;
    } while ((((VariableSymbol *)&(targetField.current)->kind)->super_ValueSymbol).super_Symbol.kind
             != Field);
  } while( true );
}

Assistant:

Expression& StructuredAssignmentPatternExpression::forStruct(
    Compilation& comp, const StructuredAssignmentPatternSyntax& syntax, const ASTContext& context,
    const Type& type, const Scope& structScope, SourceRange sourceRange) {

    bool bad = false;
    const Expression* defaultSetter = nullptr;
    SmallMap<const Symbol*, const Expression*, 8> memberMap;
    SmallVector<MemberSetter, 4> memberSetters;
    SmallVector<TypeSetter, 4> typeSetters;

    for (auto item : syntax.items) {
        if (item->key->kind == SyntaxKind::DefaultPatternKeyExpression) {
            if (defaultSetter) {
                context.addDiag(diag::AssignmentPatternKeyDupDefault, item->key->sourceRange());
                bad = true;
            }
            defaultSetter = &selfDetermined(comp, *item->expr, context);
            bad |= defaultSetter->bad();
        }
        else if (item->key->kind == SyntaxKind::IdentifierName) {
            auto nameToken = item->key->as<IdentifierNameSyntax>().identifier;
            auto name = nameToken.valueText();
            if (name.empty()) {
                bad = true;
                continue;
            }

            const Symbol* member = structScope.find(name);
            if (member) {
                auto& expr = bindRValue(member->as<FieldSymbol>().getType(), *item->expr,
                                        nameToken.range(), context);
                bad |= expr.bad();

                auto [it, inserted] = memberMap.emplace(member, &expr);
                if (!inserted) {
                    auto& diag = context.addDiag(diag::AssignmentPatternKeyDupName,
                                                 item->key->sourceRange());
                    diag << name;
                    diag.addNote(diag::NotePreviousDefinition, it->second->sourceRange);
                    bad = true;
                    continue;
                }

                memberSetters.emplace_back(MemberSetter{member, &expr});
            }
            else {
                auto found = Lookup::unqualified(*context.scope, name, LookupFlags::Type);
                if (found && found->isType()) {
                    auto& expr = bindRValue(found->as<Type>(), *item->expr, nameToken.range(),
                                            context);
                    bad |= expr.bad();

                    typeSetters.emplace_back(TypeSetter{&found->as<Type>(), &expr});
                }
                else {
                    auto& diag = context.addDiag(diag::UnknownMember, item->key->sourceRange());
                    diag << name;
                    diag << type;
                    bad = true;
                }
            }
        }
        else if (DataTypeSyntax::isKind(item->key->kind)) {
            const Type& typeKey = comp.getType(item->key->as<DataTypeSyntax>(), context);
            if (typeKey.isSimpleType()) {
                auto& expr = bindRValue(typeKey, *item->expr, {}, context);
                typeSetters.emplace_back(TypeSetter{&typeKey, &expr});
                bad |= expr.bad();
            }
            else {
                context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
                bad = true;
            }
        }
        else {
            context.addDiag(diag::AssignmentPatternKeyExpr, item->key->sourceRange());
            bad = true;
        }
    }

    SmallVector<const Expression*> elements;
    for (auto& field : structScope.membersOfType<FieldSymbol>()) {
        // If we already have a setter for this field we don't have to do anything else.
        if (auto it = memberMap.find(&field); it != memberMap.end()) {
            elements.push_back(it->second);
            continue;
        }

        const Type& fieldType = field.getType();
        if (fieldType.isError() || field.name.empty()) {
            bad = true;
            continue;
        }

        auto expr = matchElementValue(context, fieldType, &field, sourceRange, typeSetters,
                                      defaultSetter);
        if (!expr) {
            bad = true;
            continue;
        }

        elements.push_back(expr);
    }

    auto result = comp.emplace<StructuredAssignmentPatternExpression>(
        type, memberSetters.copy(comp), typeSetters.copy(comp), std::span<const IndexSetter>{},
        defaultSetter, elements.copy(comp), sourceRange);

    if (bad)
        return badExpr(comp, result);

    return *result;
}